

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

void core::image::save_pfm_file(ConstPtr *image,string *filename)

{
  element_type *peVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  ulong uVar4;
  FileException *this;
  int *piVar5;
  char *msg;
  invalid_argument *piVar6;
  ulong uVar7;
  long lVar8;
  int y;
  pointer pfVar9;
  pointer pfVar10;
  long local_270;
  ofstream out;
  int aiStack_250 [120];
  string local_70 [8];
  string scale;
  string magic_number;
  
  peVar1 = (image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Null image given");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  scale.field_2._8_8_ = &magic_number._M_string_length;
  magic_number._M_dataplus._M_p = (pointer)0x0;
  magic_number._M_string_length._0_1_ = 0;
  iVar2 = (peVar1->super_TypedImageBase<float>).super_ImageBase.c;
  if ((iVar2 != 3) && (iVar2 != 1)) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Supports 1 and 3 channel images only");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::assign(scale.field_2._M_local_buf + 8);
  std::__cxx11::string::string(local_70,"-1.0",(allocator *)&local_270);
  std::ofstream::ofstream(&local_270,(filename->_M_dataplus)._M_p,_S_bin);
  if (*(int *)((long)aiStack_250 + *(long *)(local_270 + -0x18)) != 0) {
    this = (FileException *)__cxa_allocate_exception(0x48);
    piVar5 = __errno_location();
    msg = strerror(*piVar5);
    util::FileException::FileException(this,filename,msg);
    __cxa_throw(this,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  poVar3 = std::operator<<((ostream *)&local_270,(string *)(scale.field_2._M_local_buf + 8));
  std::operator<<(poVar3,anon_var_dwarf_2342c + 10);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&local_270,
                      (((image->
                        super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->super_TypedImageBase<float>).super_ImageBase.w);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(((image->
                               super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->super_TypedImageBase<float>).super_ImageBase.h);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,local_70);
  std::operator<<(poVar3,anon_var_dwarf_2342c + 10);
  iVar2 = (*(((image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase[3])();
  peVar1 = (image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar7 = (ulong)(peVar1->super_TypedImageBase<float>).super_ImageBase.h;
  pfVar9 = (pointer)0x0;
  uVar4 = CONCAT44(extraout_var,iVar2) / uVar7;
  pfVar10 = (peVar1->super_TypedImageBase<float>).data.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start;
  lVar8 = (long)(peVar1->super_TypedImageBase<float>).data.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)pfVar10;
  if (lVar8 == 0) {
    pfVar10 = pfVar9;
  }
  pfVar10 = (pointer)((long)pfVar10 + lVar8);
  if (lVar8 == 0) {
    pfVar10 = pfVar9;
  }
  for (; (int)pfVar9 < (int)uVar7; pfVar9 = (pointer)(ulong)((int)pfVar9 + 1)) {
    pfVar10 = (pointer)((long)pfVar10 - uVar4);
    std::ostream::write((char *)&local_270,(long)pfVar10);
    uVar7 = (ulong)(uint)(((image->
                           super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr)->super_TypedImageBase<float>).super_ImageBase.h;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&local_270);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)(scale.field_2._M_local_buf + 8));
  return;
}

Assistant:

void
save_pfm_file (FloatImage::ConstPtr image, std::string const& filename)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    std::string magic_number;
    if (image->channels() == 1)
        magic_number = "Pf";
    else if (image->channels() == 3)
        magic_number = "PF";
    else
        throw std::invalid_argument("Supports 1 and 3 channel images only");

#ifdef HOST_BYTEORDER_LE
    std::string scale = "-1.0"; // we currently don't support scales
#else
    std::string scale = "1.0"; // we currently don't support scales
#endif

    std::ofstream out(filename.c_str(), std::ios::binary);
    if (!out.good())
        throw util::FileException(filename, std::strerror(errno));

    out << magic_number << "\n";
    out << image->width() << " " << image->height() << " " << scale << "\n";

    /* Output rows in reverse order according to PFM specification. */
    std::size_t row_size = image->get_byte_size() / image->height();
    char const* ptr = reinterpret_cast<char const*>(image->end()) - row_size;
    for (int y = 0; y < image->height(); ++y, ptr -= row_size)
        out.write(ptr, row_size);
    out.close();
}